

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O0

exr_result_t
internal_decode_alloc_buffer
          (exr_decode_pipeline_t *decode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  exr_result_t eVar1;
  void *pvVar2;
  exr_decode_pipeline_t *in_RCX;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  exr_coding_channel_info_t *in_R8;
  undefined8 in_R9;
  _internal_exr_part *part_1;
  _internal_exr_context *pctxt_1;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  void *curbuf;
  size_t *in_stack_ffffffffffffffc0;
  _internal_exr_context *p_Var3;
  
  if (in_R8 == (exr_coding_channel_info_t *)0x0) {
    return 0;
  }
  if (((void **)*in_RDX == (void **)0x0) || (in_RCX->channels < in_R8)) {
    internal_decode_free_buffer
              (in_RCX,(exr_transcoding_pipeline_buffer_id_t)((ulong)in_R8 >> 0x20),(void **)*in_RDX,
               in_stack_ffffffffffffffc0);
    if (*(long *)(in_RDI + 0xc0) == 0) {
      p_Var3 = *(_internal_exr_context **)(in_RDI + 0x10);
      if (p_Var3 == (_internal_exr_context *)0x0) {
        return 2;
      }
      if ((*(int *)(in_RDI + 0xc) < 0) || (p_Var3->num_parts <= *(int *)(in_RDI + 0xc))) {
        if (p_Var3->mode == '\x01') {
          internal_exr_unlock(p_Var3);
        }
        eVar1 = (*p_Var3->print_error)
                          (p_Var3,4,"Part index (%d) out of range",(ulong)*(uint *)(in_RDI + 0xc));
        return eVar1;
      }
      pvVar2 = (*p_Var3->alloc_fn)((size_t)in_R8);
    }
    else {
      pvVar2 = (void *)(**(code **)(in_RDI + 0xc0))(in_ESI,in_R8);
    }
    if (pvVar2 == (void *)0x0) {
      p_Var3 = *(_internal_exr_context **)(in_RDI + 0x10);
      if (p_Var3 == (_internal_exr_context *)0x0) {
        return 2;
      }
      if ((-1 < *(int *)(in_RDI + 0xc)) && (*(int *)(in_RDI + 0xc) < p_Var3->num_parts)) {
        eVar1 = (*p_Var3->print_error)
                          (p_Var3,1,"Unable to allocate %lu bytes",in_R8,p_Var3->print_error,in_R9,
                           p_Var3->parts[*(int *)(in_RDI + 0xc)]);
        return eVar1;
      }
      if (p_Var3->mode == '\x01') {
        internal_exr_unlock(p_Var3);
      }
      eVar1 = (*p_Var3->print_error)
                        (p_Var3,4,"Part index (%d) out of range",(ulong)*(uint *)(in_RDI + 0xc));
      return eVar1;
    }
    *in_RDX = pvVar2;
    in_RCX->channels = in_R8;
  }
  return 0;
}

Assistant:

exr_result_t
internal_decode_alloc_buffer (
    exr_decode_pipeline_t*               decode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;

    /* We might have a zero size here due to y sampling on a scanline
     * image where there is an attempt to read that portion of the
     * image. Just shortcut here and handle at a higher level where
     * there is more context
     */
    if (newsz == 0) return EXR_ERR_SUCCESS;

    if (!curbuf || *cursz < newsz)
    {
        internal_decode_free_buffer (decode, bufid, buf, cursz);

        if (decode->alloc_fn)
            curbuf = (uint8_t*) decode->alloc_fn (bufid, newsz);
        else
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                decode->context, decode->part_index);

            curbuf = (uint8_t*) pctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                decode->context, decode->part_index);

            return pctxt->print_error (
                pctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}